

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

ResolvedDecl * __thiscall
capnp::compiler::Compiler::Node::resolveId
          (ResolvedDecl *__return_storage_ptr__,Node *this,uint64_t id)

{
  unsigned_long uVar1;
  Impl *id_00;
  Node **ppNVar2;
  unsigned_long *puVar3;
  unsigned_long local_80 [2];
  Maybe<unsigned_long> local_70;
  unsigned_long local_60;
  uint64_t parentId;
  Fault local_40;
  undefined1 local_38 [8];
  Node *local_30;
  Node *_kj_result;
  Node *n;
  uint64_t id_local;
  Node *this_local;
  
  n = (Node *)id;
  id_local = (uint64_t)this;
  this_local = (Node *)__return_storage_ptr__;
  id_00 = CompiledModule::getCompiler(this->module);
  Compiler::Impl::findNode((Impl *)local_38,(uint64_t)id_00);
  local_30 = kj::_::readMaybe<capnp::compiler::Compiler::Node>
                       ((Maybe<capnp::compiler::Compiler::Node_&> *)local_38);
  if (local_30 != (Node *)0x0) {
    ppNVar2 = kj::mv<capnp::compiler::Compiler::Node*>(&local_30);
    parentId = (uint64_t)*ppNVar2;
    _kj_result = (Node *)parentId;
    kj::Maybe<capnp::compiler::Compiler::Node_&>::
    map<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_compiler_c__:927:36)>
              ((Maybe<capnp::compiler::Compiler::Node_&> *)&local_70,
               (anon_class_1_0_00000001 *)&((Node *)parentId)->parent);
    local_80[0] = 0;
    puVar3 = kj::Maybe<unsigned_long>::orDefault(&local_70,local_80);
    uVar1 = *puVar3;
    kj::Maybe<unsigned_long>::~Maybe(&local_70);
    __return_storage_ptr__->id = _kj_result->id;
    __return_storage_ptr__->genericParamCount = _kj_result->genericParamCount;
    __return_storage_ptr__->scopeId = uVar1;
    __return_storage_ptr__->kind = _kj_result->kind;
    __return_storage_ptr__->resolver = &_kj_result->super_Resolver;
    local_60 = uVar1;
    kj::Maybe<capnp::schema::Brand::Reader>::Maybe(&__return_storage_ptr__->brand);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
             ,0x39e,FAILED,"module->getCompiler().findNode(id) != nullptr","");
  kj::_::Debug::Fault::fatal(&local_40);
}

Assistant:

Resolver::ResolvedDecl Compiler::Node::resolveId(uint64_t id) {
  auto& n = KJ_ASSERT_NONNULL(module->getCompiler().findNode(id));
  uint64_t parentId = n.parent.map([](Node& n) { return n.id; }).orDefault(0);
  return { n.id, n.genericParamCount, parentId, n.kind, &n, kj::none };
}